

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait.cpp
# Opt level: O2

DWORD CorUnix::InternalWaitForMultipleObjectsEx
                (CPalThread *pThread,DWORD nCount,HANDLE *lpHandles,BOOL bWaitAll,
                DWORD dwMilliseconds,BOOL bAlertable)

{
  IPalObject **ppIVar1;
  IPalObject **ppIVar2;
  ulong cElements;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  IPalObject **p;
  undefined7 uVar8;
  uint *puVar7;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  DWORD DVar13;
  IPalObject **p_00;
  IPalObject *pIStack_178;
  IPalObject *pIPalObjStackArray [16];
  ISynchWaitController *pISyncStackArray [16];
  uint local_70;
  uint local_6c;
  bool fValue;
  undefined4 local_64;
  IPalObject **local_60;
  undefined8 local_58;
  ulong local_50;
  uint local_48;
  undefined4 local_44;
  int iSignaledObjIndex;
  byte local_31 [8];
  bool fAbandoned;
  
  local_48 = 0xffffffff;
  cElements = (ulong)nCount;
  local_31[0] = 0;
  pIPalObjStackArray[0xd] = (IPalObject *)0x0;
  pIPalObjStackArray[0xe] = (IPalObject *)0x0;
  pIPalObjStackArray[0xb] = (IPalObject *)0x0;
  pIPalObjStackArray[0xc] = (IPalObject *)0x0;
  pIPalObjStackArray[9] = (IPalObject *)0x0;
  pIPalObjStackArray[10] = (IPalObject *)0x0;
  pIPalObjStackArray[7] = (IPalObject *)0x0;
  pIPalObjStackArray[8] = (IPalObject *)0x0;
  pIPalObjStackArray[5] = (IPalObject *)0x0;
  pIPalObjStackArray[6] = (IPalObject *)0x0;
  pIPalObjStackArray[3] = (IPalObject *)0x0;
  pIPalObjStackArray[4] = (IPalObject *)0x0;
  pIPalObjStackArray[1] = (IPalObject *)0x0;
  pIPalObjStackArray[2] = (IPalObject *)0x0;
  pIStack_178 = (IPalObject *)0x0;
  pIPalObjStackArray[0] = (IPalObject *)0x0;
  pIPalObjStackArray[0xf] = (IPalObject *)0x0;
  if (nCount - 0x41 < 0xffffffc0) {
    if (!PAL_InitializeChakraCoreCalled) goto LAB_002e2d38;
    piVar6 = __errno_location();
    *piVar6 = 0x57;
    DVar13 = 0xffffffff;
    p = (IPalObject **)0x0;
    p_00 = (IPalObject **)0x0;
    goto LAB_002e2813;
  }
  local_60 = pIPalObjStackArray + 0xf;
  p = &pIStack_178;
  _fValue = bAlertable;
  if (nCount == 1) {
    local_58 = (ulong)local_58._4_4_ << 0x20;
    local_44 = 0;
LAB_002e26e2:
    local_50 = cElements;
    iVar3 = (**(code **)(*g_pObjectManager + 0x30))
                      (g_pObjectManager,pThread,lpHandles,cElements,&sg_aotWaitObject,0x100000,p);
    p_00 = local_60;
    if (iVar3 != 0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_002e2d38;
      piVar6 = __errno_location();
      if (iVar3 == 6) {
        *piVar6 = 6;
      }
      else {
        *piVar6 = 0x54f;
      }
      DVar13 = 0xffffffff;
      nCount = (DWORD)local_50;
      goto LAB_002e2813;
    }
    if ((char)local_44 != '\0') {
      uVar11 = 1;
      uVar10 = 0;
      while (uVar10 != (int)local_50 - 1) {
        ppIVar1 = p + uVar10;
        uVar10 = uVar10 + 1;
        uVar12 = uVar11;
        while (uVar12 < cElements) {
          ppIVar2 = p + uVar12;
          uVar12 = uVar12 + 1;
          if (*ppIVar2 == *ppIVar1) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_002e2d38;
            piVar6 = __errno_location();
            *piVar6 = 0x57;
            goto LAB_002e27e6;
          }
        }
        uVar11 = uVar11 + 1;
      }
    }
    uVar11 = (**(code **)(*g_pSynchronizationManager + 0x28))
                       (g_pSynchronizationManager,pThread,p,local_50,local_60);
    if ((int)uVar11 != 0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_002e2d38;
      goto LAB_002e27be;
    }
    if ((_fValue == 0) ||
       (uVar11 = (**(code **)(*g_pSynchronizationManager + 0x18))(g_pSynchronizationManager,pThread)
       , (char)uVar11 == '\0')) {
      local_48 = 0xffffffff;
      uVar10 = 0xffffffffffffffff;
      local_6c = 0;
      for (uVar12 = 0; uVar4 = (uint)uVar10, cElements != uVar12; uVar12 = uVar12 + 1) {
        uVar4 = (**local_60[uVar12]->_vptr_IPalObject)(local_60[uVar12],&local_70,local_31);
        uVar11 = (ulong)uVar4;
        if (uVar4 != 0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_002e2d38;
          piVar6 = __errno_location();
          *piVar6 = 0x54f;
          _iSignaledObjIndex = 0xffffffffffffffff;
          local_58 = local_58 & 0xffffffff00000000;
          goto LAB_002e2954;
        }
        if ((char)local_70 == '\x01') {
          local_6c = local_6c + 1;
          uVar4 = (uint)uVar12;
          local_48 = uVar4;
          if ((char)local_44 == '\0') {
            bVar9 = 0;
            goto LAB_002e296a;
          }
          uVar10 = uVar12 & 0xffffffff;
        }
      }
      bVar9 = (byte)local_44;
LAB_002e296a:
      if (((int)local_6c < (int)nCount & bVar9) != 0 || local_6c == 0) {
        if (dwMilliseconds == 0) {
          local_58 = CONCAT44(local_58._4_4_,(int)CONCAT71((int7)(uVar11 >> 8),1));
          _iSignaledObjIndex = 0x102;
          goto LAB_002e2a7f;
        }
        uVar10 = 0;
        uVar11 = 0xffffffffffffffff;
        _iSignaledObjIndex = 0xffffffffffffffff;
        do {
          uVar8 = (undefined7)(uVar11 >> 8);
          local_64 = (int)CONCAT71(uVar8,1);
          if (cElements == uVar10) {
            local_58 = CONCAT44(local_58._4_4_,(int)CONCAT71(uVar8,1));
            goto LAB_002e2a86;
          }
          uVar4 = (*local_60[uVar10]->_vptr_IPalObject[2])
                            (local_60[uVar10],local_58 & 0xffffffff,uVar10 & 0xffffffff,
                             (ulong)(_fValue == 1));
          uVar11 = (ulong)uVar4;
          uVar10 = uVar10 + 1;
        } while (uVar4 == 0);
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_002e2d38;
        puVar7 = (uint *)__errno_location();
        *puVar7 = uVar4;
        local_58 = local_58 & 0xffffffff00000000;
        goto LAB_002e2a86;
      }
      uVar5 = 0;
      if (bVar9 == 0) {
        uVar5 = uVar4;
      }
      if (-1 < (int)uVar5) {
        iVar3 = uVar4 + 1;
        if (bVar9 != 0) {
          iVar3 = (int)local_50;
        }
        uVar11 = (ulong)uVar5;
        local_58 = (ulong)iVar3;
LAB_002e2a16:
        if ((long)uVar11 < (long)local_58) goto code_r0x002e2a20;
        _iSignaledObjIndex = (ulong)local_31[0] << 7;
        local_58 = CONCAT44(local_58._4_4_,(int)CONCAT71((int7)(((ulong)local_31[0] << 7) >> 8),1));
LAB_002e2954:
        local_64 = 0;
        goto LAB_002e2a86;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_002e2d38;
      piVar6 = __errno_location();
      *piVar6 = 0x54f;
      _iSignaledObjIndex = 0xffffffffffffffff;
      p_00 = local_60;
      goto LAB_002e27ed;
    }
    for (uVar11 = 0; (cElements != uVar11 && (p_00[uVar11] != (IPalObject *)0x0));
        uVar11 = uVar11 + 1) {
      (*p_00[uVar11]->_vptr_IPalObject[3])();
      p_00[uVar11] = (IPalObject *)0x0;
    }
    iVar3 = (**(code **)(*g_pSynchronizationManager + 0x20))(g_pSynchronizationManager,pThread);
    if (iVar3 != 0) {
      fprintf(_stderr,"] %s %s:%d","InternalWaitForMultipleObjectsEx",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
              ,400);
      fprintf(_stderr,"Awakened for APC, but no APC is pending\n");
      goto LAB_002e27be;
    }
    _iSignaledObjIndex = 0xc0;
    goto LAB_002e27e9;
  }
  local_58 = CONCAT44(local_58._4_4_,2 - (uint)(bWaitAll == 0));
  local_44 = (undefined4)CONCAT71((int7)((ulong)lpHandles >> 8),bWaitAll != 0);
  if (nCount < 0x11) goto LAB_002e26e2;
  p = InternalNewArray<CorUnix::IPalObject*>(cElements);
  local_60 = (IPalObject **)InternalNewArray<CorUnix::ISynchWaitController*>(cElements);
  if (p != (IPalObject **)0x0 && local_60 != (IPalObject **)0x0) goto LAB_002e26e2;
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_002e2d38;
  DVar13 = 0xffffffff;
  piVar6 = __errno_location();
  *piVar6 = 8;
  p_00 = local_60;
  goto LAB_002e2818;
code_r0x002e2a20:
  iVar3 = (*local_60[uVar11]->_vptr_IPalObject[1])();
  uVar11 = uVar11 + 1;
  if (iVar3 != 0) goto code_r0x002e2a35;
  goto LAB_002e2a16;
code_r0x002e2a35:
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_002e2d38;
  piVar6 = __errno_location();
  *piVar6 = iVar3;
  _iSignaledObjIndex = 0xffffffffffffffff;
  local_58 = local_58 & 0xffffffff00000000;
LAB_002e2a7f:
  local_64 = 0;
LAB_002e2a86:
  for (uVar11 = 0; p_00 = local_60, cElements != uVar11; uVar11 = uVar11 + 1) {
    (*local_60[uVar11]->_vptr_IPalObject[3])();
    p_00[uVar11] = (IPalObject *)0x0;
  }
  if ((char)local_58 == '\0') goto LAB_002e27ed;
  if ((char)local_64 == '\0') {
    uVar4 = (uint)local_50;
    goto LAB_002e2b14;
  }
  iVar3 = (**(code **)*g_pSynchronizationManager)
                    (g_pSynchronizationManager,pThread,dwMilliseconds,_fValue == 1,0,&local_70,
                     &local_48);
  if (iVar3 != 0) {
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_002e2d38:
      abort();
    }
    piVar6 = __errno_location();
    *piVar6 = iVar3;
    goto LAB_002e27ed;
  }
  uVar4 = (uint)local_50;
  switch((ulong)local_70) {
  case 0:
    _iSignaledObjIndex = (ulong)local_70;
    goto LAB_002e2b14;
  case 1:
    if (_fValue == 0) {
      fprintf(_stderr,"] %s %s:%d","InternalWaitForMultipleObjectsEx",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
              ,0x21e);
      uVar4 = (uint)local_50;
      fprintf(_stderr,
              "Expression: bAlertable, Description: Awakened for APC from a non-alertable wait\n");
    }
    iVar3 = (**(code **)(*g_pSynchronizationManager + 0x20))(g_pSynchronizationManager,pThread);
    _iSignaledObjIndex = 0xc0;
    if (iVar3 != 0) {
      fprintf(_stderr,"] %s %s:%d","InternalWaitForMultipleObjectsEx",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
              ,0x224);
      uVar4 = (uint)local_50;
      fprintf(_stderr,
              "Expression: NO_ERROR == palErr, Description: Awakened for APC, but no APC is pending\n"
             );
    }
    goto LAB_002e2b14;
  case 2:
    _iSignaledObjIndex = 0x80;
    break;
  case 3:
    _iSignaledObjIndex = 0x102;
    break;
  default:
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_002e2d38;
    _iSignaledObjIndex = 0xffffffffffffffff;
  }
LAB_002e2b14:
  if ((char)local_44 == '\0' && (_iSignaledObjIndex & 0xffffff7f) == 0) {
    if ((int)local_48 < 0) {
      fprintf(_stderr,"] %s %s:%d","InternalWaitForMultipleObjectsEx",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
              ,0x231);
      uVar4 = (uint)local_50;
      fprintf(_stderr,
              "Expression: 0 <= iSignaledObjIndex, Description: Failed to identify signaled/abandoned object\n"
             );
    }
    if ((int)local_48 < 0 || uVar4 <= local_48) {
      fprintf(_stderr,"] %s %s:%d","InternalWaitForMultipleObjectsEx",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
              ,0x235);
      fprintf(_stderr,
              "Expression: iSignaledObjIndex >= 0 && nCount > static_cast<DWORD>(iSignaledObjIndex), Description: SignaledObjIndex object out of range [index=%d obj_count=%u\n"
              ,(ulong)local_6c,local_50);
      if ((int)local_48 < 0) {
LAB_002e27be:
        piVar6 = __errno_location();
        *piVar6 = 0x54f;
LAB_002e27e6:
        _iSignaledObjIndex = 0xffffffffffffffff;
LAB_002e27e9:
        goto LAB_002e27ed;
      }
    }
    _iSignaledObjIndex = (ulong)((int)_iSignaledObjIndex + local_48);
  }
LAB_002e27ed:
  for (uVar11 = 0; cElements != uVar11; uVar11 = uVar11 + 1) {
    (*p[uVar11]->_vptr_IPalObject[8])(p[uVar11],pThread);
    p[uVar11] = (IPalObject *)0x0;
  }
  nCount = (DWORD)local_50;
  DVar13 = (DWORD)_iSignaledObjIndex;
LAB_002e2813:
  if (0x10 < nCount) {
LAB_002e2818:
    InternalDeleteArray<CorUnix::IPalObject*>(p);
    InternalDeleteArray<CorUnix::ISynchWaitController*>((ISynchWaitController **)p_00);
  }
  return DVar13;
}

Assistant:

DWORD CorUnix::InternalWaitForMultipleObjectsEx(
    CPalThread * pThread,
    DWORD nCount,
    CONST HANDLE *lpHandles,
    BOOL bWaitAll,
    DWORD dwMilliseconds,
    BOOL bAlertable)
{
    DWORD dwRet = WAIT_FAILED;
    PAL_ERROR palErr = NO_ERROR;
    int i, iSignaledObjCount, iSignaledObjIndex = -1;
    bool fWAll = (bool)bWaitAll, fNeedToBlock  = false;
    bool fAbandoned = false;
    WaitType wtWaitType;

    IPalObject            * pIPalObjStackArray[MAXIMUM_STACK_WAITOBJ_ARRAY_SIZE] = { NULL };
    ISynchWaitController  * pISyncStackArray[MAXIMUM_STACK_WAITOBJ_ARRAY_SIZE] = { NULL };
    IPalObject           ** ppIPalObjs = pIPalObjStackArray;
    ISynchWaitController ** ppISyncWaitCtrlrs = pISyncStackArray;

    if ((nCount == 0) || (nCount > MAXIMUM_WAIT_OBJECTS))
    {
        ppIPalObjs = NULL;        // make delete at the end safe
        ppISyncWaitCtrlrs = NULL; // make delete at the end safe
        ERROR("Invalid object count=%d [range: 1 to %d]\n",
               nCount, MAXIMUM_WAIT_OBJECTS);
        pThread->SetLastError(ERROR_INVALID_PARAMETER);
        goto WFMOExIntExit;
    }
    else if (nCount == 1)
    {
        fWAll = false;  // makes no difference when nCount is 1
        wtWaitType = SingleObject;
    }
    else
    {
        wtWaitType = fWAll ? MultipleObjectsWaitAll : MultipleObjectsWaitOne;
        if (nCount > MAXIMUM_STACK_WAITOBJ_ARRAY_SIZE)
        {
            ppIPalObjs = InternalNewArray<IPalObject*>(nCount);
            ppISyncWaitCtrlrs = InternalNewArray<ISynchWaitController*>(nCount);
            if ((NULL == ppIPalObjs) || (NULL == ppISyncWaitCtrlrs))
            {
                ERROR("Out of memory allocating internal structures\n");
                pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto WFMOExIntExit;
            }
        }
    }

    palErr = g_pObjectManager->ReferenceMultipleObjectsByHandleArray(pThread,
                                                                     (VOID **)lpHandles,
                                                                     nCount,
                                                                     &sg_aotWaitObject,
                                                                     SYNCHRONIZE,
                                                                     ppIPalObjs);
    if (NO_ERROR != palErr)
    {
        ERROR("Unable to obtain object for some or all of the handles [error=%u]\n",
              palErr);
        if (palErr == ERROR_INVALID_HANDLE)
            pThread->SetLastError(ERROR_INVALID_HANDLE);
        else
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
        goto WFMOExIntExit;
    }

    if (fWAll)
    {
        // For a wait-all operation, check for duplicate wait objects in the array. This just uses a brute-force O(n^2)
        // algorithm, but since MAXIMUM_WAIT_OBJECTS is small, the worst case is not so bad, and the average case would involve
        // significantly fewer items.
        for (DWORD i = 0; i < nCount - 1; ++i)
        {
            IPalObject *const objectToCheck = ppIPalObjs[i];
            for (DWORD j = i + 1; j < nCount; ++j)
            {
                if (ppIPalObjs[j] == objectToCheck)
                {
                    ERROR("Duplicate handle provided for a wait-all operation [error=%u]\n", ERROR_INVALID_PARAMETER);
                    pThread->SetLastError(ERROR_INVALID_PARAMETER);
                    goto WFMOExIntCleanup;
                }
            }
        }
    }

    palErr = g_pSynchronizationManager->GetSynchWaitControllersForObjects(
        pThread, ppIPalObjs, nCount, ppISyncWaitCtrlrs);
    if (NO_ERROR != palErr)
    {
        ERROR("Unable to obtain ISynchWaitController interface for some or all "
              "of the objects [error=%u]\n", palErr);
        pThread->SetLastError(ERROR_INTERNAL_ERROR);
        goto WFMOExIntCleanup;
    }

    if (bAlertable)
    {
        // First check for pending APC. We need to do that while holding the global
        // synch lock implicitely grabbed by GetSynchWaitControllersForObjects
        if (g_pSynchronizationManager->AreAPCsPending(pThread))
        {
            // If there is any pending APC we need to release the
            // implicit global synch lock before calling into it
            for (i = 0; (i < (int)nCount) && (NULL != ppISyncWaitCtrlrs[i]); i++)
            {
                ppISyncWaitCtrlrs[i]->ReleaseController();
                ppISyncWaitCtrlrs[i] = NULL;
            }
            palErr = g_pSynchronizationManager->DispatchPendingAPCs(pThread);
            if (NO_ERROR == palErr)
            {
                dwRet = WAIT_IO_COMPLETION;
            }
            else
            {
                ASSERT("Awakened for APC, but no APC is pending\n");
                pThread->SetLastError(ERROR_INTERNAL_ERROR);
                dwRet = WAIT_FAILED;
            }
            goto WFMOExIntCleanup;
        }
    }

    iSignaledObjCount = 0;
    iSignaledObjIndex = -1;
    for (i=0;i<(int)nCount;i++)
    {
        bool fValue;
        palErr = ppISyncWaitCtrlrs[i]->CanThreadWaitWithoutBlocking(&fValue, &fAbandoned);
        if (NO_ERROR != palErr)
        {
            ERROR("ISynchWaitController::CanThreadWaitWithoutBlocking() failed for "
                  "%d-th object [handle=%p error=%u]\n", i, lpHandles[i], palErr);
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
            goto WFMOExIntReleaseControllers;
        }
        if (fValue)
        {
            iSignaledObjCount++;
            iSignaledObjIndex = i;
            if (!fWAll)
                break;
        }
    }

    fNeedToBlock = (iSignaledObjCount == 0) || (fWAll && (iSignaledObjCount < (int)nCount));
    if (!fNeedToBlock)
    {
        // At least one object signaled, or bWaitAll==TRUE and all object signaled.
        // No need to wait, let's unsignal the object(s) and return without blocking
        int iStartIdx, iEndIdx;

        if (fWAll)
        {
            iStartIdx = 0;
            iEndIdx = nCount;
        }
        else
        {
            iStartIdx = iSignaledObjIndex;
            iEndIdx = iStartIdx + 1;
        }

        // Unsignal objects
        if( iStartIdx < 0 )
        {
            ERROR("Buffer underflow due to iStartIdx < 0");
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
            dwRet = WAIT_FAILED;
            goto WFMOExIntCleanup;
        }
        for (i = iStartIdx; i < iEndIdx; i++)
        {
            palErr = ppISyncWaitCtrlrs[i]->ReleaseWaitingThreadWithoutBlocking();
            if (NO_ERROR != palErr)
            {
                ERROR("ReleaseWaitingThreadWithoutBlocking() failed for %d-th "
                      "object [handle=%p error=%u]\n",
                      i, lpHandles[i], palErr);
                pThread->SetLastError(palErr);
                goto WFMOExIntReleaseControllers;
            }
        }

        dwRet = (fAbandoned ? WAIT_ABANDONED_0 : WAIT_OBJECT_0);
    }
    else if (0 == dwMilliseconds)
    {
        // Not enough objects signaled, but timeout is zero: no actual wait
        dwRet = WAIT_TIMEOUT;
        fNeedToBlock = false;
    }
    else
    {
        // Register the thread for waiting on all objects
        for (i=0;i<(int)nCount;i++)
        {
            palErr = ppISyncWaitCtrlrs[i]->RegisterWaitingThread(
                                                        wtWaitType,
                                                        i,
                                                        (TRUE == bAlertable));
            if (NO_ERROR != palErr)
            {
                ERROR("RegisterWaitingThread() failed for %d-th object "
                      "[handle=%p error=%u]\n", i, lpHandles[i], palErr);
                pThread->SetLastError(palErr);
                goto WFMOExIntReleaseControllers;
            }
        }
    }

WFMOExIntReleaseControllers:
    // Release all controllers before going to sleep
    for (i = 0; i < (int)nCount; i++)
    {
        ppISyncWaitCtrlrs[i]->ReleaseController();
        ppISyncWaitCtrlrs[i] = NULL;
    }
    if (NO_ERROR != palErr)
        goto WFMOExIntCleanup;

    if (fNeedToBlock)
    {
        ThreadWakeupReason twrWakeupReason;

        //
        // Going to sleep
        //
        palErr = g_pSynchronizationManager->BlockThread(pThread,
                                                        dwMilliseconds,
                                                        (TRUE == bAlertable),
                                                        false,
                                                        &twrWakeupReason,
                                                        (DWORD *)&iSignaledObjIndex);
        //
        // Awakened
        //
        if (NO_ERROR != palErr)
        {
            ERROR("IPalSynchronizationManager::BlockThread failed for thread "
                  "pThread=%p [error=%u]\n", pThread, palErr);
            pThread->SetLastError(palErr);
            goto WFMOExIntCleanup;
        }
        switch (twrWakeupReason)
        {
        case WaitSucceeded:
            dwRet = WAIT_OBJECT_0; // offset added later
            break;
        case MutexAbondoned:
            dwRet =  WAIT_ABANDONED_0; // offset added later
            break;
        case WaitTimeout:
            dwRet = WAIT_TIMEOUT;
            break;
        case Alerted:
            _ASSERT_MSG(bAlertable,
                        "Awakened for APC from a non-alertable wait\n");

            dwRet = WAIT_IO_COMPLETION;
            palErr = g_pSynchronizationManager->DispatchPendingAPCs(pThread);

            _ASSERT_MSG(NO_ERROR == palErr,
                        "Awakened for APC, but no APC is pending\n");
            break;
        case WaitFailed:
        default:
            ERROR("Thread %p awakened with some failure\n", pThread);
            dwRet = WAIT_FAILED;
            break;
        }
    }

    if (!fWAll && ((WAIT_OBJECT_0 == dwRet) || (WAIT_ABANDONED_0 == dwRet)))
    {
        _ASSERT_MSG(0 <= iSignaledObjIndex,
                    "Failed to identify signaled/abandoned object\n");
        _ASSERT_MSG(iSignaledObjIndex >= 0 && nCount > static_cast<DWORD>(iSignaledObjIndex),
                    "SignaledObjIndex object out of range "
                    "[index=%d obj_count=%u\n",
                    iSignaledObjCount, nCount);

        if (iSignaledObjIndex < 0)
        {
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
            dwRet = WAIT_FAILED;
            goto WFMOExIntCleanup;
        }
        dwRet += iSignaledObjIndex;
    }

WFMOExIntCleanup:
    for (i = 0; i < (int)nCount; i++)
    {
        ppIPalObjs[i]->ReleaseReference(pThread);
        ppIPalObjs[i] = NULL;
    }

WFMOExIntExit:
    if (nCount > MAXIMUM_STACK_WAITOBJ_ARRAY_SIZE)
    {
        InternalDeleteArray(ppIPalObjs);
        InternalDeleteArray(ppISyncWaitCtrlrs);
    }

    return dwRet;
}